

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parse.cpp
# Opt level: O2

Token * __thiscall
EOPlus::Parser_Token_Server_Base::GetToken
          (Token *__return_storage_ptr__,Parser_Token_Server_Base *this,uint allow)

{
  int iVar1;
  _Elt_pointer pTVar2;
  TokenType TVar3;
  Token t;
  undefined1 local_1a0 [72];
  int local_158;
  undefined1 local_150 [64];
  undefined1 local_110 [80];
  undefined1 local_c0 [64];
  undefined1 local_80 [80];
  
  util::variant::variant((variant *)local_c0);
  iVar1 = 0;
  Token::Token((Token *)local_1a0,Invalid,(variant *)local_c0);
  std::__cxx11::string::~string((string *)(local_c0 + 0x10));
  TVar3 = allow & NewLine;
  while( true ) {
    pTVar2 = (this->token_buffer).c.super__Deque_base<EOPlus::Token,_std::allocator<EOPlus::Token>_>
             ._M_impl.super__Deque_impl_data._M_finish._M_cur;
    if (pTVar2 == (this->token_buffer).c.
                  super__Deque_base<EOPlus::Token,_std::allocator<EOPlus::Token>_>._M_impl.
                  super__Deque_impl_data._M_start._M_cur) {
      (**this->_vptr_Parser_Token_Server_Base)((Token *)local_80,this);
      Token::operator=((Token *)local_1a0,(Token *)local_80);
      std::__cxx11::string::~string((string *)(local_80 + 0x18));
    }
    else {
      if (pTVar2 == (this->token_buffer).c.
                    super__Deque_base<EOPlus::Token,_std::allocator<EOPlus::Token>_>._M_impl.
                    super__Deque_impl_data._M_finish._M_first) {
        pTVar2 = (this->token_buffer).c.
                 super__Deque_base<EOPlus::Token,_std::allocator<EOPlus::Token>_>._M_impl.
                 super__Deque_impl_data._M_finish._M_node[-1] + 6;
      }
      Token::operator=((Token *)local_1a0,pTVar2 + -1);
      std::deque<EOPlus::Token,_std::allocator<EOPlus::Token>_>::pop_back(&(this->token_buffer).c);
    }
    if (local_1a0._0_4_ != NewLine) break;
    this->line = this->line + 1;
    if (TVar3 != Invalid) {
      iVar1 = 0;
LAB_0012f51e:
      local_158 = iVar1;
      if (TVar3 == local_1a0._0_4_) {
        Token::Token(__return_storage_ptr__,(Token *)local_1a0);
      }
      else {
        Token::Token((Token *)local_110,(Token *)local_1a0);
        PutBack(this,(Token *)local_110);
        std::__cxx11::string::~string((string *)(local_110 + 0x18));
        util::variant::variant((variant *)local_150);
        Token::Token(__return_storage_ptr__,Invalid,(variant *)local_150);
        std::__cxx11::string::~string((string *)(local_150 + 0x10));
      }
      std::__cxx11::string::~string((string *)(local_1a0 + 0x18));
      return __return_storage_ptr__;
    }
    iVar1 = iVar1 + 1;
  }
  TVar3 = allow & local_1a0._0_4_;
  goto LAB_0012f51e;
}

Assistant:

Token Parser_Token_Server_Base::GetToken(unsigned int allow)
	{
		Token t;
		int newlines = 0;

		while (true)
		{
			if (!this->token_buffer.empty())
			{
				t = this->token_buffer.top();
				this->token_buffer.pop();
			}
			else
			{
				t = this->xGetToken();
			}

			if (t.type == Token::NewLine)
			{
				++this->line;

				if ((Token::NewLine & allow) == Token::NewLine)
					break;

				++newlines;
			}
			else
			{
				break;
			}
		}

		t.newlines = newlines;

		if ((t.type & allow) != t.type)
		{
			this->PutBack(t);
			return Token();
		}

		return t;
	}